

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::instruction_to_result_type
          (Compiler *this,uint32_t *result_type,uint32_t *result_id,Op op,uint32_t *args,
          uint32_t length)

{
  SPIRType *pSVar1;
  
  if ((((0x3d < op - OpEmitStreamVertex) ||
       ((0x3000010000000133U >> ((ulong)(op - OpEmitStreamVertex) & 0x3f) & 1) == 0)) &&
      ((0x20 < op - OpGroupCommitReadPipe ||
       ((0x14000cc03U >> ((ulong)(op - OpGroupCommitReadPipe) & 0x3f) & 1) == 0)))) &&
     ((((0x25 < op - OpStore || ((0x2000000007U >> ((ulong)(op - OpStore) & 0x3f) & 1) == 0)) &&
       (op != OpLine)) &&
      ((1 < length &&
       (pSVar1 = maybe_get<spirv_cross::SPIRType>(this,*args), pSVar1 != (SPIRType *)0x0)))))) {
    *result_type = *args;
    *result_id = args[1];
    return true;
  }
  return false;
}

Assistant:

bool Compiler::instruction_to_result_type(uint32_t &result_type, uint32_t &result_id, spv::Op op, const uint32_t *args,
                                          uint32_t length)
{
	// Most instructions follow the pattern of <result-type> <result-id> <arguments>.
	// There are some exceptions.
	switch (op)
	{
	case OpStore:
	case OpCopyMemory:
	case OpCopyMemorySized:
	case OpImageWrite:
	case OpAtomicStore:
	case OpAtomicFlagClear:
	case OpEmitStreamVertex:
	case OpEndStreamPrimitive:
	case OpControlBarrier:
	case OpMemoryBarrier:
	case OpGroupWaitEvents:
	case OpRetainEvent:
	case OpReleaseEvent:
	case OpSetUserEventStatus:
	case OpCaptureEventProfilingInfo:
	case OpCommitReadPipe:
	case OpCommitWritePipe:
	case OpGroupCommitReadPipe:
	case OpGroupCommitWritePipe:
	case OpLine:
	case OpNoLine:
		return false;

	default:
		if (length > 1 && maybe_get<SPIRType>(args[0]) != nullptr)
		{
			result_type = args[0];
			result_id = args[1];
			return true;
		}
		else
			return false;
	}
}